

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAranges.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugAranges::extract(DWARFDebugAranges *this,DataExtractor DebugArangesData)

{
  DataExtractor data;
  bool bVar1;
  uint32_t uVar2;
  desc_iterator_range dVar3;
  pair<llvm::detail::DenseSetImpl<unsigned_long,_llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_llvm::DenseMapInfo<unsigned_long>_>::Iterator,_bool>
  local_d8;
  uint64_t local_c0;
  uint64_t HighPC;
  uint64_t LowPC;
  Descriptor *Desc;
  __normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
  __end2;
  __normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
  __begin2;
  desc_iterator_range *__range2;
  uint64_t CUOffset;
  char *local_68;
  size_t sStack_60;
  undefined8 local_58;
  undefined1 local_48 [8];
  DWARFDebugArangeSet Set;
  uint64_t Offset;
  DWARFDebugAranges *this_local;
  
  bVar1 = DataExtractor::isValidOffset(&DebugArangesData,0);
  if (bVar1) {
    Set.ArangeDescriptors.
    super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DWARFDebugArangeSet::DWARFDebugArangeSet((DWARFDebugArangeSet *)local_48);
    while( true ) {
      data = DebugArangesData;
      local_58._0_1_ = DebugArangesData.IsLittleEndian;
      local_58._1_1_ = DebugArangesData.AddressSize;
      local_58._2_6_ = DebugArangesData._18_6_;
      DebugArangesData.Data.Data = data.Data.Data;
      local_68 = DebugArangesData.Data.Data;
      DebugArangesData.Data.Length = data.Data.Length;
      sStack_60 = DebugArangesData.Data.Length;
      DebugArangesData = data;
      bVar1 = DWARFDebugArangeSet::extract
                        ((DWARFDebugArangeSet *)local_48,data,
                         (uint64_t *)
                         &Set.ArangeDescriptors.
                          super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      uVar2 = DWARFDebugArangeSet::getCompileUnitDIEOffset((DWARFDebugArangeSet *)local_48);
      __range2 = (desc_iterator_range *)(ulong)uVar2;
      dVar3 = DWARFDebugArangeSet::descriptors((DWARFDebugArangeSet *)local_48);
      __begin2 = dVar3.begin_iterator._M_current;
      __end2 = iterator_range<__gnu_cxx::__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>_>
               ::begin((iterator_range<__gnu_cxx::__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>_>
                        *)&__begin2);
      Desc = (Descriptor *)
             iterator_range<__gnu_cxx::__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>_>
             ::end((iterator_range<__gnu_cxx::__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>_>
                    *)&__begin2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
                                         *)&Desc), bVar1) {
        LowPC = (uint64_t)
                __gnu_cxx::
                __normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
                ::operator*(&__end2);
        HighPC = ((reference)LowPC)->Address;
        local_c0 = DWARFDebugArangeSet::Descriptor::getEndAddress((Descriptor *)LowPC);
        appendRange(this,(uint64_t)__range2,HighPC,local_c0);
        __gnu_cxx::
        __normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
        ::operator++(&__end2);
      }
      detail::
      DenseSetImpl<unsigned_long,_llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_llvm::DenseMapInfo<unsigned_long>_>
      ::insert(&local_d8,
               &(this->ParsedCUOffsets).
                super_DenseSetImpl<unsigned_long,_llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_llvm::DenseMapInfo<unsigned_long>_>
               ,(unsigned_long *)&__range2);
    }
    DWARFDebugArangeSet::~DWARFDebugArangeSet((DWARFDebugArangeSet *)local_48);
  }
  return;
}

Assistant:

void DWARFDebugAranges::extract(DataExtractor DebugArangesData) {
  if (!DebugArangesData.isValidOffset(0))
    return;
  uint64_t Offset = 0;
  DWARFDebugArangeSet Set;

  while (Set.extract(DebugArangesData, &Offset)) {
    uint64_t CUOffset = Set.getCompileUnitDIEOffset();
    for (const auto &Desc : Set.descriptors()) {
      uint64_t LowPC = Desc.Address;
      uint64_t HighPC = Desc.getEndAddress();
      appendRange(CUOffset, LowPC, HighPC);
    }
    ParsedCUOffsets.insert(CUOffset);
  }
}